

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
eval_divide_by_single_limb
          (uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
          limb_type short_denominator,unsigned_fast_type u_offset,
          uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *remainder)

{
  size_type sVar1;
  pointer pvVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> dStack_28;
  
  pvVar2 = (this->values).
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems;
  lVar6 = (long)(0x20000000000 - (u_offset << 0x20)) >> 0x1e;
  uVar5 = 0;
  uVar4 = 0;
  while( true ) {
    if (lVar6 == 0) break;
    uVar5 = CONCAT44((int)uVar5 - (int)uVar4 * short_denominator,
                     *(undefined4 *)((long)pvVar2 + lVar6 + -4));
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar5;
    uVar4 = SUB168(auVar3 / ZEXT416(short_denominator),0);
    *(int *)((long)pvVar2 + lVar6 + -4) = SUB164(auVar3 / ZEXT416(short_denominator),0);
    lVar6 = lVar6 + -4;
  }
  if (remainder != (uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)0x0) {
    uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
    uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::value&&std
    ::is_unsigned<unsigned_int>::value)&&(std::numeric_limits<unsigned_int>::digits<=std::
    numeric_limits<unsigned_int>::digits),void>::type__
              (&dStack_28,(int)uVar5 - (int)uVar4 * short_denominator,
               (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_<__std::numeric_limits<limb_type>::digits))>
                *)0x0);
    sVar1 = (remainder->values).
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
            elem_count;
    (remainder->values).
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
         dStack_28.elem_count;
    pvVar2 = (remainder->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    (remainder->values).
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
         dStack_28.elems;
    dStack_28.elem_count = sVar1;
    dStack_28.elems = pvVar2;
    util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
    ~dynamic_array(&dStack_28);
  }
  return;
}

Assistant:

constexpr auto eval_divide_by_single_limb(const limb_type          short_denominator,
                                              const unsigned_fast_type u_offset,
                                                    uintwide_t*        remainder) -> void
    {
      // The denominator has one single limb.
      // Use a one-dimensional division algorithm.

      auto long_numerator = double_limb_type { };
      auto hi_part        = static_cast<limb_type>(UINT8_C(0));

      {
        reverse_iterator
          ri
          {
            detail::advance_and_point
            (
              values.begin(),
              static_cast<size_t>(number_of_limbs - static_cast<size_t>(u_offset))
            )
          };

        for( ; ri != values.rend(); ++ri) // NOLINT(altera-id-dependent-backward-branch)
        {
          long_numerator =
            static_cast<double_limb_type>
            (
               *ri
             + static_cast<double_limb_type>
               (
                    static_cast<double_limb_type>
                    (
                        long_numerator
                      - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                    )
                 << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
               )
            );

          *ri = detail::make_lo<limb_type>(static_cast<double_limb_type>(long_numerator / short_denominator));

          hi_part = *ri;
        }
      }

      if(remainder != nullptr)
      {
        long_numerator =
          static_cast<double_limb_type>
          (
             static_cast<double_limb_type>(*values.cbegin())
           + static_cast<double_limb_type>
             (
                  static_cast<double_limb_type>
                  (
                    long_numerator - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                  )
               << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
             )
          );

        *remainder =
          static_cast<limb_type>
          (
            long_numerator >> static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
          );
      }
    }